

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O0

void ut::are_equal<agge::font_hinting,agge::font_hinting>
               (font_hinting *expected,font_hinting *actual,LocationInfo *location)

{
  FailedAssertion *this;
  allocator local_41;
  string local_40;
  LocationInfo *local_20;
  LocationInfo *location_local;
  font_hinting *actual_local;
  font_hinting *expected_local;
  
  if (*expected != *actual) {
    local_20 = location;
    location_local = (LocationInfo *)actual;
    actual_local = expected;
    this = (FailedAssertion *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"Values are not equal!",&local_41);
    FailedAssertion::FailedAssertion(this,&local_40,local_20);
    __cxa_throw(this,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
  }
  return;
}

Assistant:

inline void are_equal(const T1 &expected, const T2 &actual, const LocationInfo &location)
	{
		if (!(expected == actual))
			throw FailedAssertion("Values are not equal!", location);
	}